

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead_matcher.hpp
# Opt level: O3

bool __thiscall
boost::xpressive::detail::
lookahead_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (lookahead_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
           *this,undefined8 *state,long *next)

{
  undefined8 *puVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  size_t count;
  undefined8 uVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  byte bVar13;
  char cVar14;
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ptr;
  ulong uVar15;
  long lVar16;
  long lVar17;
  node_base *pnVar18;
  long lVar19;
  long lVar20;
  nested_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *out;
  node_base *out_00;
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  
  uVar3 = *state;
  count = state[2];
  lVar16 = state[0xb];
  local_58.
  super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current = (char *)state[3];
  local_58.
  super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .matched = false;
  local_58.
  super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._20_4_ = 0;
  local_58.zero_width_ = false;
  ptr = *(sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          **)(lVar16 + 0x18);
  local_58.
  super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .second._M_current =
       local_58.
       super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .first._M_current;
  local_58.begin_._M_current =
       local_58.
       super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .first._M_current;
  if ((ulong)((*(long *)(lVar16 + 0x20) - (long)ptr >> 3) * -0x3333333333333333) < count) {
    ptr = sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::grow_((sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(lVar16 + 8),count,&local_58);
  }
  else {
    *(sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      **)(lVar16 + 0x18) = ptr + count;
  }
  lVar20 = 0;
  for (lVar16 = *(long *)(state[7] + 0x70); lVar16 != state[7] + 0x68;
      lVar16 = *(long *)(lVar16 + 8)) {
    lVar20 = lVar20 + 1;
  }
  uVar4 = state[0xd];
  puVar5 = (undefined8 *)state[0xe];
  puVar1 = state + 0x10;
  uVar11 = *puVar1;
  uVar9 = *puVar1;
  uVar7 = *puVar1;
  puVar1 = state + 0x11;
  uVar12 = *puVar1;
  uVar10 = *puVar1;
  uVar8 = *puVar1;
  state[0xd] = 0;
  state[0xe] = state + 0xd;
  if (0 < (long)state[2]) {
    lVar16 = state[1];
    uVar15 = state[2] + 1;
    lVar19 = 0;
    do {
      *(undefined8 *)
       ((long)&(ptr->
               super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .first._M_current + lVar19) = *(undefined8 *)(lVar16 + lVar19);
      *(undefined8 *)
       ((long)&(ptr->
               super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .second._M_current + lVar19) = *(undefined8 *)(lVar16 + 8 + lVar19);
      (&(ptr->
        super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).matched)[lVar19] = *(bool *)(lVar16 + 0x10 + lVar19);
      uVar6 = *(undefined8 *)(lVar16 + 0x19 + lVar19);
      *(undefined8 *)
       (&(ptr->
         super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ).field_0x14 + lVar19) = *(undefined8 *)(lVar16 + 0x14 + lVar19);
      *(undefined8 *)((long)&(ptr->begin_)._M_current + lVar19 + 1) = uVar6;
      uVar15 = uVar15 - 1;
      lVar19 = lVar19 + 0x28;
    } while (1 < uVar15);
  }
  puVar1 = state + 0x10;
  if (this[8] ==
      (lookahead_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
       )0x1) {
    uVar2 = *(undefined1 *)((long)state + 0x31);
    bVar13 = (**(code **)(**(long **)this + 0x10))(*(long **)this,state);
    state[0xd] = uVar4;
    state[0xe] = puVar5;
    *puVar5 = 0;
    if (bVar13 == 0) {
      cVar14 = (**(code **)(*next + 0x10))(next,state);
      lVar16 = *(long *)(state[7] + 0x70);
      lVar19 = state[7] + 0x68;
      if (cVar14 == '\0') {
        lVar17 = 0;
        for (; lVar16 != lVar19; lVar16 = *(long *)(lVar16 + 8)) {
          lVar17 = lVar17 + 1;
        }
        if (lVar17 == lVar20) {
          sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::unwind_to((sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)(state[0xb] + 8),ptr);
        }
        *puVar1 = uVar11;
        state[0x11] = uVar12;
        *(undefined1 *)((long)state + 0x31) = uVar2;
        goto LAB_00136b38;
      }
      lVar17 = 0;
      for (; lVar16 != lVar19; lVar16 = *(long *)(lVar16 + 8)) {
        lVar17 = lVar17 + 1;
      }
      if (lVar17 == lVar20) {
        sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::unwind_to((sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(state[0xb] + 8),ptr);
      }
    }
    else {
      out = (nested_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(state[7] + 0x68);
      lVar16 = 0;
      for (pnVar18 = *(node_base **)(state[7] + 0x70); pnVar18 != (node_base *)out;
          pnVar18 = pnVar18->_next) {
        lVar16 = lVar16 + 1;
      }
      if (lVar16 != lVar20) {
        lVar19 = state[0xb];
        lVar20 = lVar20 - lVar16;
        do {
          results_cache<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reclaim_last((results_cache<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(lVar19 + 0x28),out);
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0);
      }
      if (0 < (long)state[2]) {
        lVar16 = state[1];
        uVar15 = state[2] + 1;
        lVar20 = 0;
        do {
          *(undefined8 *)(lVar16 + lVar20) =
               *(undefined8 *)
                ((long)&(ptr->
                        super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ).
                        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .first._M_current + lVar20);
          *(undefined8 *)(lVar16 + 8 + lVar20) =
               *(undefined8 *)
                ((long)&(ptr->
                        super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ).
                        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .second._M_current + lVar20);
          *(bool *)(lVar16 + 0x10 + lVar20) =
               (&(ptr->
                 super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).matched)[lVar20];
          uVar4 = *(undefined8 *)((long)&(ptr->begin_)._M_current + lVar20 + 1);
          *(undefined8 *)(lVar16 + 0x14 + lVar20) =
               *(undefined8 *)
                (&(ptr->
                  super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ).field_0x14 + lVar20);
          *(undefined8 *)(lVar16 + 0x19 + lVar20) = uVar4;
          uVar15 = uVar15 - 1;
          lVar20 = lVar20 + 0x28;
        } while (1 < uVar15);
      }
      sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::unwind_to((sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(state[0xb] + 8),ptr);
      *puVar1 = uVar7;
      state[0x11] = uVar8;
      *state = uVar3;
    }
    bVar13 = bVar13 ^ 1;
    *(undefined1 *)((long)state + 0x31) = uVar2;
  }
  else {
    cVar14 = (**(code **)(**(long **)this + 0x10))(*(long **)this,state);
    if (cVar14 == '\0') {
      state[0xd] = uVar4;
      state[0xe] = puVar5;
      *puVar5 = 0;
      lVar19 = 0;
      for (lVar16 = *(long *)(state[7] + 0x70); lVar16 != state[7] + 0x68;
          lVar16 = *(long *)(lVar16 + 8)) {
        lVar19 = lVar19 + 1;
      }
      if (lVar19 == lVar20) goto LAB_00136abb;
    }
    else {
      *state = uVar3;
      state[0xd] = uVar4;
      state[0xe] = puVar5;
      *puVar5 = 0;
      cVar14 = (**(code **)(*next + 0x10))(next,state);
      pnVar18 = *(node_base **)(state[7] + 0x70);
      out_00 = (node_base *)(state[7] + 0x68);
      if (cVar14 != '\0') {
        lVar16 = 0;
        for (; pnVar18 != out_00; pnVar18 = pnVar18->_next) {
          lVar16 = lVar16 + 1;
        }
        if (lVar16 != lVar20) {
          return true;
        }
        sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::unwind_to((sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(state[0xb] + 8),ptr);
        return true;
      }
      lVar16 = 0;
      for (; pnVar18 != out_00; pnVar18 = pnVar18->_next) {
        lVar16 = lVar16 + 1;
      }
      if (lVar16 != lVar20) {
        lVar19 = state[0xb];
        lVar20 = lVar20 - lVar16;
        do {
          results_cache<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reclaim_last((results_cache<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(lVar19 + 0x28),
                         (nested_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)out_00);
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0);
      }
      if (0 < (long)state[2]) {
        lVar16 = state[1];
        uVar15 = state[2] + 1;
        lVar20 = 0;
        do {
          *(undefined8 *)(lVar16 + lVar20) =
               *(undefined8 *)
                ((long)&(ptr->
                        super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ).
                        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .first._M_current + lVar20);
          *(undefined8 *)(lVar16 + 8 + lVar20) =
               *(undefined8 *)
                ((long)&(ptr->
                        super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ).
                        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .second._M_current + lVar20);
          *(bool *)(lVar16 + 0x10 + lVar20) =
               (&(ptr->
                 super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).matched)[lVar20];
          uVar3 = *(undefined8 *)((long)&(ptr->begin_)._M_current + lVar20 + 1);
          *(undefined8 *)(lVar16 + 0x14 + lVar20) =
               *(undefined8 *)
                (&(ptr->
                  super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ).field_0x14 + lVar20);
          *(undefined8 *)(lVar16 + 0x19 + lVar20) = uVar3;
          uVar15 = uVar15 - 1;
          lVar20 = lVar20 + 0x28;
        } while (1 < uVar15);
      }
LAB_00136abb:
      sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::unwind_to((sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(state[0xb] + 8),ptr);
    }
    *puVar1 = uVar9;
    state[0x11] = uVar10;
LAB_00136b38:
    bVar13 = 0;
  }
  return (bool)bVar13;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, mpl::false_) const
        {
            BidiIter const tmp = state.cur_;

            // matching xpr could produce side-effects, save state
            memento<BidiIter> mem = save_sub_matches(state);

            if(this->not_)
            {
                // negative look-ahead assertions do not trigger partial matches.
                save_restore<bool> partial_match(state.found_partial_match_);
                detail::ignore_unused(partial_match);

                if(this->xpr_.match(state))
                {
                    restore_action_queue(mem, state);
                    restore_sub_matches(mem, state);
                    state.cur_ = tmp;
                    return false;
                }
                restore_action_queue(mem, state);
                if(next.match(state))
                {
                    reclaim_sub_matches(mem, state, true);
                    return true;
                }
                reclaim_sub_matches(mem, state, false);
            }
            else
            {
                if(!this->xpr_.match(state))
                {
                    restore_action_queue(mem, state);
                    reclaim_sub_matches(mem, state, false);
                    return false;
                }
                state.cur_ = tmp;
                restore_action_queue(mem, state);
                if(next.match(state))
                {
                    reclaim_sub_matches(mem, state, true);
                    return true;
                }
                restore_sub_matches(mem, state);
            }

            BOOST_ASSERT(state.cur_ == tmp);
            return false;
        }